

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerStrictBrOrCm
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool noMathFastPath,bool isBranch,
          bool isHelper)

{
  LowererMD *this_00;
  Instr *pIVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  OpndKind OVar6;
  uint32 uVar7;
  undefined4 *puVar8;
  LabelInstr *pLVar9;
  LabelInstr *branchTarget;
  BranchInstr *pBVar10;
  RegOpnd *pRVar11;
  IndirOpnd *pIVar12;
  RegOpnd *pRVar13;
  IntConstOpnd *pIVar14;
  Opnd *pOVar15;
  Lowerer *this_01;
  Lowerer *pLVar16;
  undefined7 in_register_00000081;
  LibraryValue valueType;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_76;
  LibraryValue local_74;
  LabelInstr *local_70;
  RegOpnd *local_68;
  JnHelperMethod local_5c;
  RegOpnd *local_58;
  LabelInstr *local_50;
  LabelInstr *local_48;
  undefined4 local_40;
  LibraryValue local_3c;
  Lowerer *local_38;
  
  local_40 = (undefined4)CONCAT71(in_register_00000081,isBranch);
  pIVar1 = instr->m_prev;
  local_5c = helperMethod;
  bVar4 = IR::Instr::IsNeq(instr);
  local_68 = (RegOpnd *)instr->m_src1;
  local_58 = (RegOpnd *)instr->m_src2;
  local_38 = this;
  if (local_68 == (RegOpnd *)0x0 || local_58 == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2947,"(src1 != nullptr && src2 != nullptr)","Expected 2 src opnds on BrC")
    ;
    if (!bVar5) goto LAB_005d65eb;
    *puVar8 = 0;
  }
  this_01 = local_38;
  pLVar9 = IR::LabelInstr::New(Label,local_38->m_func,true);
  if (noMathFastPath) {
    IR::Instr::InsertBefore(instr,&pLVar9->super_Instr);
    if ((char)local_40 != '\0') {
LAB_005d64d1:
      LowerBrCMem(this_01,instr,local_5c,true,true);
      return pIVar1;
    }
  }
  else {
    local_48 = pLVar9;
    pLVar9 = IR::Instr::GetOrCreateContinueLabel(instr,isHelper);
    local_70 = pLVar9;
    if ((char)local_40 == '\0') {
      local_50 = IR::LabelInstr::New(Label,this_01->m_func,isHelper);
      branchTarget = IR::LabelInstr::New(Label,this_01->m_func,isHelper);
      valueType = ValueFalse - bVar4;
      local_3c = bVar4 + ValueTrue;
    }
    else if (bVar4) {
      if (instr->m_kind != InstrKindBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
        if (!bVar4) goto LAB_005d65eb;
        *puVar8 = 0;
        this_01 = local_38;
      }
      valueType = ValueInvalid;
      local_3c = ValueInvalid;
      branchTarget = (LabelInstr *)instr[1].m_next;
      local_50 = pLVar9;
    }
    else {
      if (instr->m_kind != InstrKindBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
        if (!bVar4) goto LAB_005d65eb;
        *puVar8 = 0;
        this_01 = local_38;
      }
      local_50 = (LabelInstr *)instr[1].m_next;
      valueType = ValueInvalid;
      local_3c = ValueInvalid;
      branchTarget = pLVar9;
    }
    pRVar13 = local_68;
    bVar4 = IR::Opnd::IsEqual(&local_68->super_Opnd,&local_58->super_Opnd);
    if (bVar4) {
      local_76 = (instr->m_src1->m_valueType).field_0;
      bVar4 = ValueType::IsNotFloat((ValueType *)&local_76.field_0);
      pLVar9 = local_70;
      if (bVar4) {
        if ((char)local_40 == '\0') {
          pOVar2 = instr->m_dst;
          pOVar15 = LoadLibraryValueOpnd(this_01,instr,local_3c);
          InsertMove(pOVar2,pOVar15,instr,true);
          InsertBranch(Br,false,pLVar9,instr);
        }
        else {
          pBVar10 = IR::BranchInstr::New(JMP,local_50,this_01->m_func);
          IR::Instr::InsertBefore(instr,&pBVar10->super_Instr);
        }
        IR::Instr::Remove(instr);
        return pIVar1;
      }
      OVar6 = IR::Opnd::GetKind(&local_68->super_Opnd);
      pLVar9 = local_70;
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) {
LAB_005d65eb:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
        this_01 = local_38;
      }
      LowererMD::GenerateObjectTest
                (&this_01->m_lowererMD,&local_68->super_Opnd,instr,local_48,false);
      pBVar10 = IR::BranchInstr::New(JMP,local_50,this_01->m_func);
      IR::Instr::InsertBefore(instr,&pBVar10->super_Instr);
    }
    else {
      OVar6 = IR::Opnd::GetKind(&pRVar13->super_Opnd);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005d65eb;
        *puVar8 = 0;
        this_01 = local_38;
      }
      pRVar13 = local_68;
      this_00 = &this_01->m_lowererMD;
      pLVar16 = (Lowerer *)this_00;
      local_74 = valueType;
      LowererMD::GenerateObjectTest(this_00,&local_68->super_Opnd,instr,local_48,false);
      InsertCompareBranch(pLVar16,&pRVar13->super_Opnd,&local_58->super_Opnd,BrEq_A,false,local_50,
                          instr,false);
      pRVar11 = IR::RegOpnd::New(TyInt64,this_01->m_func);
      OVar6 = IR::Opnd::GetKind(&pRVar13->super_Opnd);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005d65eb;
        *puVar8 = 0;
        this_01 = local_38;
      }
      pIVar12 = IR::IndirOpnd::New(pRVar13,8,TyInt64,this_01->m_func,false);
      InsertMove(&pRVar11->super_Opnd,&pIVar12->super_Opnd,instr,true);
      pRVar13 = IR::RegOpnd::New(TyInt32,this_01->m_func);
      uVar7 = Js::Type::GetOffsetOfTypeId();
      pIVar12 = IR::IndirOpnd::New(pRVar11,uVar7,TyInt32,this_01->m_func,false);
      InsertMove(&pRVar13->super_Opnd,&pIVar12->super_Opnd,instr,true);
      pLVar16 = (Lowerer *)0x17;
      pIVar14 = IR::IntConstOpnd::New(0x17,TyInt32,this_01->m_func,true);
      pLVar9 = local_48;
      InsertCompareBranch(pLVar16,&pRVar13->super_Opnd,&pIVar14->super_Opnd,BrLe_A,false,local_48,
                          instr,false);
      pLVar16 = (Lowerer *)0x50;
      pIVar14 = IR::IntConstOpnd::New(0x50,TyInt32,this_01->m_func,true);
      InsertCompareBranch(pLVar16,&pRVar13->super_Opnd,&pIVar14->super_Opnd,BrEq_A,false,pLVar9,
                          instr,false);
      uVar7 = Js::Type::GetOffsetOfFlags();
      pIVar12 = IR::IndirOpnd::New(pRVar11,uVar7,TyInt8,this_01->m_func,false);
      pIVar14 = IR::IntConstOpnd::New(8,TyInt8,this_01->m_func,false);
      InsertTest(&pIVar12->super_Opnd,&pIVar14->super_Opnd,instr);
      InsertBranch(BrNeq_A,false,pLVar9,instr);
      pRVar13 = local_58;
      OVar6 = IR::Opnd::GetKind(&local_58->super_Opnd);
      valueType = local_74;
      if (OVar6 == OpndKindReg) {
        OVar6 = IR::Opnd::GetKind(&pRVar13->super_Opnd);
        if (OVar6 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar4) goto LAB_005d65eb;
          *puVar8 = 0;
          pRVar13 = local_58;
        }
        LowererMD::GenerateObjectTest(this_00,&pRVar13->super_Opnd,instr,local_48,false);
        pRVar11 = IR::RegOpnd::New(TyInt64,local_38->m_func);
        OVar6 = IR::Opnd::GetKind(&pRVar13->super_Opnd);
        if (OVar6 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar4) goto LAB_005d65eb;
          *puVar8 = 0;
        }
        this_01 = local_38;
        pIVar12 = IR::IndirOpnd::New(local_58,8,TyInt64,local_38->m_func,false);
        InsertMove(&pRVar11->super_Opnd,&pIVar12->super_Opnd,instr,true);
        uVar7 = Js::Type::GetOffsetOfFlags();
        pIVar12 = IR::IndirOpnd::New(pRVar11,uVar7,TyInt8,this_01->m_func,false);
        pIVar14 = IR::IntConstOpnd::New(8,TyInt8,this_01->m_func,false);
        InsertTest(&pIVar12->super_Opnd,&pIVar14->super_Opnd,instr);
        InsertBranch(BrNeq_A,false,local_48,instr);
      }
      pBVar10 = IR::BranchInstr::New(JMP,branchTarget,this_01->m_func);
      IR::Instr::InsertBefore(instr,&pBVar10->super_Instr);
      pLVar9 = local_70;
    }
    if ((char)local_40 != '\0') {
      IR::Instr::InsertBefore(instr,&local_48->super_Instr);
      goto LAB_005d64d1;
    }
    IR::Instr::InsertBefore(instr,&local_50->super_Instr);
    pOVar2 = instr->m_dst;
    pOVar15 = LoadLibraryValueOpnd(local_38,instr,local_3c);
    InsertMove(pOVar2,pOVar15,instr,true);
    InsertBranch(Br,false,pLVar9,instr);
    IR::Instr::InsertBefore(instr,&branchTarget->super_Instr);
    pOVar2 = instr->m_dst;
    pOVar15 = LoadLibraryValueOpnd(local_38,instr,valueType);
    this_01 = local_38;
    InsertMove(pOVar2,pOVar15,instr,true);
    InsertBranch(Br,false,pLVar9,instr);
    IR::Instr::InsertBefore(instr,&local_48->super_Instr);
  }
  LowerBinaryHelperMem(this_01,instr,local_5c);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerStrictBrOrCm(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool noMathFastPath, bool isBranch, bool isHelper)
{
    IR::Instr * instrPrev = instr->m_prev;

    IR::LabelInstr * labelHelper = nullptr;
    IR::LabelInstr * labelFallThrough = nullptr;
    IR::LabelInstr * labelBranchSuccess = nullptr;
    IR::LabelInstr * labelBranchFailure = nullptr;
    LibraryValue successValueType = ValueInvalid;
    LibraryValue failureValueType = ValueInvalid;

    bool isEqual = !instr->IsNeq();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();

    AssertMsg(src1 != nullptr && src2 != nullptr, "Expected 2 src opnds on BrC");

    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (!noMathFastPath)
    {
        labelFallThrough = instr->GetOrCreateContinueLabel(isHelper);

        if (!isBranch)
        {
            labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            labelBranchFailure = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            successValueType = isEqual ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
            failureValueType = isEqual ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;
        }
        else
        {
            labelBranchSuccess = isEqual ? instr->AsBranchInstr()->GetTarget() : labelFallThrough;
            labelBranchFailure = isEqual ? labelFallThrough : instr->AsBranchInstr()->GetTarget();
        }

        if (src1->IsEqual(src2))
        {
            if (instr->GetSrc1()->GetValueType().IsNotFloat())
            {
                if (!isBranch)
                {
                    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
                    InsertBranch(Js::OpCode::Br, labelFallThrough, instr);
                }
                else
                {
                    IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchSuccess, this->m_func);
                    instr->InsertBefore(branch);
                }
                instr->Remove();
                return instrPrev;
            }
#if !FLOATVAR
            m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper);
            IR::RegOpnd *src1TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            Lowerer::InsertMove(src1TypeReg, IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func), instr);

            // MOV src1TypeIdReg, [src1TypeReg + offset(typeId)]
            IR::RegOpnd *src1TypeIdReg = IR::RegOpnd::New(TyInt32, this->m_func);
            Lowerer::InsertMove(src1TypeIdReg, IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func), instr);

            // CMP src1TypeIdReg, TypeIds_Number
            // JEQ $helper
            IR::IntConstOpnd *numberTypeId = IR::IntConstOpnd::New(Js::TypeIds_Number, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, numberTypeId, Js::OpCode::BrEq_A, labelHelper, instr);
#else
            m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper);
#endif
            IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchSuccess, this->m_func);
            instr->InsertBefore(branch);
        }
        else
        {
            m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper);

#if !FLOATVAR
            IR::RegOpnd *src1TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            Lowerer::InsertMove(src1TypeReg, IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func), instr);

            // MOV src1TypeIdReg, [src1TypeReg + offset(typeId)]
            IR::RegOpnd *src1TypeIdReg = IR::RegOpnd::New(TyInt32, this->m_func);
            Lowerer::InsertMove(src1TypeIdReg, IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func), instr);

            // CMP src1TypeIdReg, TypeIds_Number
            // JEQ $helper
            IR::IntConstOpnd *numberTypeId = IR::IntConstOpnd::New(Js::TypeIds_Number, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, numberTypeId, Js::OpCode::BrEq_A, labelHelper, instr);
#endif
            //      CMP src1, src2                       - Ptr comparison
            //      JEQ $branchSuccess
            InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);

#if FLOATVAR
            IR::RegOpnd *src1TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            Lowerer::InsertMove(src1TypeReg, IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func), instr);

            // MOV src1TypeIdReg, [src1TypeReg + offset(typeId)]
            IR::RegOpnd *src1TypeIdReg = IR::RegOpnd::New(TyInt32, this->m_func);
            Lowerer::InsertMove(src1TypeIdReg, IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func), instr);
#endif
            // CMP src1TypeIdReg, TypeIds_HostDispatch
            // JLE $helper (le condition covers string, int64, uint64, hostdispatch, as well as undefined, null, boolean)
            IR::IntConstOpnd *hostDispatchTypeId = IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, hostDispatchTypeId, Js::OpCode::BrLe_A, labelHelper, instr);

            // CMP src1TypeIdReg, TypeIds_GlobalObject
            // JE $helper
            IR::IntConstOpnd *globalObjectTypeId = IR::IntConstOpnd::New(Js::TypeIds_GlobalObject, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, globalObjectTypeId, Js::OpCode::BrEq_A, labelHelper, instr);

            // TEST src1TypeReg->flags, TypeFlagMask_EngineExternal
            // JE $helper

            IR::Opnd *flags = IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfFlags(), TyInt8, this->m_func);
            InsertTestBranch(flags, IR::IntConstOpnd::New(TypeFlagMask_EngineExternal, TyInt8, this->m_func), Js::OpCode::BrNeq_A, labelHelper, instr);

            if (src2->IsRegOpnd())
            {
                m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper);
                // MOV src2TypeReg, [src2 + offset(type)]
                // TEST [src2TypeReg + offset(flags)], TypeFlagMask_EngineExternal
                // JE $helper
                IR::RegOpnd *src2TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
                IR::IndirOpnd *src2Type = IR::IndirOpnd::New(src2->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
                Lowerer::InsertMove(src2TypeReg, src2Type, instr);
                IR::Opnd *src2Flags = IR::IndirOpnd::New(src2TypeReg, Js::Type::GetOffsetOfFlags(), TyInt8, this->m_func);
                InsertTestBranch(src2Flags, IR::IntConstOpnd::New(TypeFlagMask_EngineExternal, TyInt8, this->m_func), Js::OpCode::BrNeq_A, labelHelper, instr);
            }

            // JMP $done
            IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchFailure, this->m_func);
            instr->InsertBefore(branch);
        }

        if (!isBranch)
        {
            instr->InsertBefore(labelBranchSuccess);
            InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
            InsertBranch(Js::OpCode::Br, labelFallThrough, instr);

            instr->InsertBefore(labelBranchFailure);
            InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, failureValueType), instr);
            InsertBranch(Js::OpCode::Br, labelFallThrough, instr);
        }
    }

    instr->InsertBefore(labelHelper);

    if (isBranch)
    {
        LowerBrCMem(instr, helperMethod, true, true);
    }
    else
    {
        LowerBinaryHelperMem(instr, helperMethod);
    }

    return instrPrev;
}